

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::DefaultSkewItemSyntax::setChild
          (DefaultSkewItemSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00481aa0 + *(int *)(&DAT_00481aa0 + index * 4)))();
  return;
}

Assistant:

void DefaultSkewItemSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: direction = child.node() ? &child.node()->as<ClockingDirectionSyntax>() : nullptr; return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}